

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Count<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
::TestBody(Count<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __normal_iterator<std::pair<const_int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_>
  _Var3;
  long lVar4;
  pointer *__ptr;
  char *pcVar5;
  pair<const_int,_phmap::priv::NonStandardLayout> *ppVar6;
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  values;
  TypeParam m;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_798;
  internal local_790 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_788;
  AssertHelper local_780;
  undefined1 local_778 [16];
  undefined1 local_768 [40];
  __normal_iterator<std::pair<const_int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_>
  _Stack_740;
  slot_type *local_738;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_730;
  
  local_768._32_8_ = (pair<const_int,_phmap::priv::NonStandardLayout> *)0x0;
  _Stack_740._M_current = (pair<const_int,_phmap::priv::NonStandardLayout> *)0x0;
  local_738 = (slot_type *)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int_const,phmap::priv::NonStandardLayout>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,phmap::priv::NonStandardLayout>,void>>
            ();
  _Var3._M_current = _Stack_740._M_current;
  lVar4 = 0x68;
  do {
    *(undefined8 *)(local_768 + lVar4) = 0;
    *(undefined8 *)(local_768 + lVar4 + 8) = 0;
    *(undefined8 *)(local_778 + lVar4) = 0;
    *(undefined8 *)(local_778 + lVar4 + 8) = 0;
    *(undefined8 *)((long)&local_788 + lVar4) = 0;
    *(undefined8 *)((long)&local_780.data_ + lVar4) = 0;
    *(undefined8 *)(local_790 + lVar4 + -8) = 0;
    *(undefined8 *)(local_790 + lVar4) = 0;
    *(undefined8 *)(local_768 + lVar4 + 0x10) = 0;
    *(undefined8 *)(local_768 + lVar4 + 0x20) = 0;
    *(long *)((long)&_Stack_740._M_current + lVar4) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_730.sets_._M_elems + lVar4 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_730.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar4) = 0;
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0x768);
  if ((pair<const_int,_phmap::priv::NonStandardLayout> *)local_768._32_8_ != _Stack_740._M_current)
  {
    ppVar6 = (pair<const_int,_phmap::priv::NonStandardLayout> *)local_768._32_8_;
    do {
      local_780.data_._0_4_ = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)ppVar6->first;
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ::find<int>((iterator *)local_778,&local_730,&ppVar6->first,
                  SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
      local_798._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((Inner *)local_778._0_8_ != (Inner *)0x0);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_790,"0","m.count(p.first)",(int *)&local_780,(unsigned_long *)&local_798);
      if (local_790[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_798);
        testing::PrintToString<int>((string *)local_778,&ppVar6->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_798._M_head_impl + 0x10),(char *)local_778._0_8_,
                   local_778._8_8_);
        pcVar5 = "";
        if (local_788 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_788->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_780,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x4a,pcVar5);
        testing::internal::AssertHelper::operator=(&local_780,(Message *)&local_798);
        testing::internal::AssertHelper::~AssertHelper(&local_780);
        if ((Inner *)local_778._0_8_ != (Inner *)local_768) {
          operator_delete((void *)local_778._0_8_,(ulong)(local_768._0_8_ + 1));
        }
        if (local_798._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_798._M_head_impl + 8))();
        }
      }
      if (local_788 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_788,local_788);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != _Var3._M_current);
  }
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<int_const,phmap::priv::NonStandardLayout>*,std::vector<std::pair<int_const,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int_const,phmap::priv::NonStandardLayout>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_730,
             (__normal_iterator<std::pair<const_int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_>
              )local_768._32_8_,_Stack_740);
  _Var3._M_current = _Stack_740._M_current;
  if ((pair<const_int,_phmap::priv::NonStandardLayout> *)local_768._32_8_ != _Stack_740._M_current)
  {
    ppVar6 = (pair<const_int,_phmap::priv::NonStandardLayout> *)local_768._32_8_;
    do {
      local_780.data_._0_4_ = 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)ppVar6->first;
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ::find<int>((iterator *)local_778,&local_730,&ppVar6->first,
                  SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0));
      local_798._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((Inner *)local_778._0_8_ != (Inner *)0x0);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_790,"1","m.count(p.first)",(int *)&local_780,(unsigned_long *)&local_798);
      if (local_790[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_798);
        testing::PrintToString<int>((string *)local_778,&ppVar6->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_798._M_head_impl + 0x10),(char *)local_778._0_8_,
                   local_778._8_8_);
        pcVar5 = "";
        if (local_788 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_788->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_780,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x4d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_780,(Message *)&local_798);
        testing::internal::AssertHelper::~AssertHelper(&local_780);
        if ((Inner *)local_778._0_8_ != (Inner *)local_768) {
          operator_delete((void *)local_778._0_8_,(ulong)(local_768._0_8_ + 1));
        }
        if (local_798._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_798._M_head_impl + 8))();
        }
      }
      if (local_788 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_788,local_788);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != _Var3._M_current);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_730);
  std::
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector((vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             *)(local_768 + 0x20));
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}